

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  zip_t *pzVar4;
  char *pcVar5;
  ssize_t sVar6;
  unsigned_long_long uVar7;
  FILE *__s;
  undefined8 uVar8;
  
  minunit_setup = test_setup;
  minunit_teardown = test_teardown;
  if ((((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) && (minunit_proc_timer == 0.0))
     && (!NAN(minunit_proc_timer))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  minunit_status = '\0';
  pzVar4 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar4 == (zip_t *)0x0) {
    pcVar5 = "zip != NULL";
    uVar8 = 0x27;
LAB_001025b7:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uVar8,pcVar5);
    minunit_status = '\x01';
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar3 = zip_entry_open(pzVar4,"test/test-1.txt");
    if (uVar3 == 0) {
      putchar(0x2e);
      minunit_assert = minunit_assert + 1;
      uVar3 = zip_entry_write(pzVar4,"Some test data 1...",0x13);
      if (uVar3 == 0) {
        putchar(0x2e);
        minunit_assert = minunit_assert + 1;
        pcVar5 = zip_entry_name(pzVar4);
        uVar3 = strcmp(pcVar5,"test/test-1.txt");
        if (uVar3 == 0) {
          putchar(0x2e);
          minunit_assert = minunit_assert + 1;
          sVar6 = zip_entry_index(pzVar4);
          if ((int)sVar6 == 0) {
            putchar(0x2e);
            minunit_assert = minunit_assert + 1;
            uVar7 = zip_entry_size(pzVar4);
            if ((int)uVar7 == 0x13) {
              putchar(0x2e);
              minunit_assert = minunit_assert + 1;
              uVar3 = zip_entry_crc32(pzVar4);
              if (uVar3 != 0x845ecdfa) {
                pcVar5 = "CRC32DATA1 == zip_entry_crc32(zip)";
                uVar8 = 0x2e;
                goto LAB_001025b7;
              }
              putchar(0x2e);
              minunit_assert = minunit_assert + 1;
              uVar3 = zip_entry_close(pzVar4);
              if (uVar3 == 0) {
                putchar(0x2e);
                minunit_assert = minunit_assert + 1;
                uVar3 = zip_is64(pzVar4);
                if (uVar3 == 1) {
                  putchar(0x2e);
                  zip_close(pzVar4);
                }
                else {
                  snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                           "test_write",
                           "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                           ,0x31,1,(ulong)uVar3);
                  minunit_status = '\x01';
                }
              }
              else {
                snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                         "test_write",
                         "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                         ,0x2f,0,(ulong)uVar3);
                minunit_status = '\x01';
              }
            }
            else {
              snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                       "test_write",
                       "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                       ,0x2d,0x13,uVar7);
              minunit_status = '\x01';
            }
          }
          else {
            snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                     "test_write",
                     "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                     ,0x2c,0,sVar6);
            minunit_status = '\x01';
          }
        }
        else {
          snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                   "test_write",
                   "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                   ,0x2b,0,(ulong)uVar3);
          minunit_status = '\x01';
        }
      }
      else {
        snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                 "test_write",
                 "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
                 0x2a,0,(ulong)uVar3);
        minunit_status = '\x01';
      }
    }
    else {
      snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d","test_write"
               ,"/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
               0x29,0,(ulong)uVar3);
      minunit_status = '\x01';
    }
  }
  minunit_run = minunit_run + 1;
  if (minunit_status == '\x01') {
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  minunit_status = '\0';
  pzVar4 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar4 == (zip_t *)0x0) {
    pcVar5 = "zip != NULL";
    uVar8 = 0x38;
LAB_00102a7e:
    snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_write_utf",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uVar8,pcVar5);
    minunit_status = '\x01';
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar3 = zip_entry_open(pzVar4,anon_var_dwarf_1b8);
    if (uVar3 == 0) {
      putchar(0x2e);
      minunit_assert = minunit_assert + 1;
      uVar3 = zip_entry_write(pzVar4,"Some test data 1...",0x13);
      if (uVar3 == 0) {
        putchar(0x2e);
        minunit_assert = minunit_assert + 1;
        pcVar5 = zip_entry_name(pzVar4);
        uVar3 = strcmp(pcVar5,anon_var_dwarf_1b8);
        if (uVar3 == 0) {
          putchar(0x2e);
          minunit_assert = minunit_assert + 1;
          sVar6 = zip_entry_index(pzVar4);
          if ((int)sVar6 == 0) {
            putchar(0x2e);
            minunit_assert = minunit_assert + 1;
            uVar7 = zip_entry_size(pzVar4);
            if ((int)uVar7 == 0x13) {
              putchar(0x2e);
              minunit_assert = minunit_assert + 1;
              uVar3 = zip_entry_crc32(pzVar4);
              if (uVar3 != 0x845ecdfa) {
                pcVar5 = "CRC32DATA1 == zip_entry_crc32(zip)";
                uVar8 = 0x40;
                goto LAB_00102a7e;
              }
              putchar(0x2e);
              minunit_assert = minunit_assert + 1;
              uVar3 = zip_entry_close(pzVar4);
              if (uVar3 == 0) {
                putchar(0x2e);
                minunit_assert = minunit_assert + 1;
                uVar3 = zip_is64(pzVar4);
                if (uVar3 == 1) {
                  putchar(0x2e);
                  zip_close(pzVar4);
                }
                else {
                  snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                           "test_write_utf",
                           "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                           ,0x43,1,(ulong)uVar3);
                  minunit_status = '\x01';
                }
              }
              else {
                snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                         "test_write_utf",
                         "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                         ,0x41,0,(ulong)uVar3);
                minunit_status = '\x01';
              }
            }
            else {
              snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                       "test_write_utf",
                       "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                       ,0x3f,0x13,uVar7);
              minunit_status = '\x01';
            }
          }
          else {
            snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                     "test_write_utf",
                     "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                     ,0x3e,0,sVar6);
            minunit_status = '\x01';
          }
        }
        else {
          snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                   "test_write_utf",
                   "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                   ,0x3d,0,(ulong)uVar3);
          minunit_status = '\x01';
        }
      }
      else {
        snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                 "test_write_utf",
                 "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
                 0x3b,0,(ulong)uVar3);
        minunit_status = '\x01';
      }
    }
    else {
      snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
               "test_write_utf",
               "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
               0x3a,0,(ulong)uVar3);
      minunit_status = '\x01';
    }
  }
  minunit_run = minunit_run + 1;
  if (minunit_status == '\x01') {
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    builtin_strncpy(ZIPNAME,"z-XXXXXX",9);
    ZIPNAME[9] = '\0';
    ZIPNAME[10] = '\0';
    ZIPNAME[0xb] = '\0';
    ZIPNAME[0xc] = '\0';
    ZIPNAME[0xd] = '\0';
    ZIPNAME[0xe] = '\0';
    ZIPNAME[0xf] = '\0';
    ZIPNAME[0x10] = '\0';
    ZIPNAME[0x11] = '\0';
    ZIPNAME[0x12] = '\0';
    ZIPNAME[0x13] = '\0';
    builtin_strncpy(WFILE,"w-XXXXXX",9);
    WFILE[9] = '\0';
    WFILE[10] = '\0';
    WFILE[0xb] = '\0';
    WFILE[0xc] = '\0';
    WFILE[0xd] = '\0';
    WFILE[0xe] = '\0';
    WFILE[0xf] = '\0';
    WFILE[0x10] = '\0';
    WFILE[0x11] = '\0';
    WFILE[0x12] = '\0';
    WFILE[0x13] = '\0';
    mkstemp(ZIPNAME);
    mkstemp(WFILE);
  }
  minunit_status = '\0';
  __s = fopen(WFILE,"w+");
  if (__s == (FILE *)0x0) {
    minunit_assert = minunit_assert + 1;
    pcVar5 = "Cannot open filename\n";
    uVar8 = 0x53;
  }
  else {
    fwrite("Some test data 1...",1,0x13,__s);
    minunit_assert = minunit_assert + 1;
    uVar3 = fclose(__s);
    if (uVar3 != 0) {
      snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
               "test_fwrite",
               "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
               0x56,0,(ulong)uVar3);
      minunit_status = '\x01';
      goto LAB_00102f69;
    }
    putchar(0x2e);
    pzVar4 = zip_open(ZIPNAME,9,'w');
    minunit_assert = minunit_assert + 1;
    if (pzVar4 != (zip_t *)0x0) {
      putchar(0x2e);
      minunit_assert = minunit_assert + 1;
      uVar3 = zip_entry_open(pzVar4,WFILE);
      if (uVar3 == 0) {
        putchar(0x2e);
        minunit_assert = minunit_assert + 1;
        uVar3 = zip_entry_fwrite(pzVar4,WFILE);
        if (uVar3 == 0) {
          putchar(0x2e);
          minunit_assert = minunit_assert + 1;
          uVar3 = zip_entry_close(pzVar4);
          if (uVar3 == 0) {
            putchar(0x2e);
            minunit_assert = minunit_assert + 1;
            uVar3 = zip_is64(pzVar4);
            if (uVar3 == 1) {
              putchar(0x2e);
              zip_close(pzVar4);
            }
            else {
              snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                       "test_fwrite",
                       "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                       ,0x5d,1,(ulong)uVar3);
              minunit_status = '\x01';
            }
          }
          else {
            snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                     "test_fwrite",
                     "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                     ,0x5c,0,(ulong)uVar3);
            minunit_status = '\x01';
          }
        }
        else {
          snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                   "test_fwrite",
                   "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c"
                   ,0x5b,0,(ulong)uVar3);
          minunit_status = '\x01';
        }
      }
      else {
        snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %d expected but was %d",
                 "test_fwrite",
                 "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
                 0x5a,0,(ulong)uVar3);
        minunit_status = '\x01';
      }
      goto LAB_00102f69;
    }
    pcVar5 = "zip != NULL";
    uVar8 = 0x59;
  }
  snprintf(minunit_last_message,0x400,"%s failed:\n\t%s:%d: %s","test_fwrite",
           "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",uVar8,
           pcVar5);
  minunit_status = '\x01';
LAB_00102f69:
  minunit_run = minunit_run + 1;
  if (minunit_status == '\x01') {
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    unlink(WFILE);
    unlink(ZIPNAME);
  }
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar1 = mu_timer_real();
  dVar2 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",
         SUB84(dVar1 - minunit_real_timer,0),dVar2 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

MU_TEST_SUITE(test_write_suite) {
  MU_SUITE_CONFIGURE(&test_setup, &test_teardown);

  MU_RUN_TEST(test_write);
  MU_RUN_TEST(test_write_utf);
  MU_RUN_TEST(test_fwrite);
}